

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

void inputLoop(void)

{
  long lVar1;
  int *piVar2;
  bool bVar3;
  int local_4c;
  duration<long,_std::ratio<1L,_1L>_> local_48;
  lock_guard<std::mutex> local_40;
  lock_guard<std::mutex> guard;
  undefined1 local_28 [8];
  string input;
  
  std::__cxx11::string::string((string *)local_28);
  while( true ) {
    lVar1 = ftell(_stdin);
    bVar3 = true;
    if (lVar1 == -1) {
      piVar2 = __errno_location();
      bVar3 = *piVar2 != 9;
    }
    if (!bVar3) break;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)local_28);
    do {
      std::lock_guard<std::mutex>::lock_guard(&local_40,&console_input.input_mutex);
      bVar3 = (console_input.awaiting_processing & 1U) != 0;
      if (bVar3) {
        local_4c = 1;
        std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                  ((duration<long,std::ratio<1l,1l>> *)&local_48,&local_4c);
        std::this_thread::sleep_for<long,std::ratio<1l,1l>>(&local_48);
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&console_input.input,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28);
        console_input.awaiting_processing = true;
      }
      std::lock_guard<std::mutex>::~lock_guard(&local_40);
    } while (bVar3);
  }
  std::__cxx11::string::~string((string *)local_28);
  return;
}

Assistant:

void inputLoop() {
	std::string input;
	while (ftell(stdin) != -1 || errno != EBADF) {
		std::getline(std::cin, input);

	check_input_processing:

		std::lock_guard<std::mutex> guard(console_input.input_mutex);
		if (console_input.awaiting_processing == false)
		{
			console_input.input = input;
			console_input.awaiting_processing = true;
		}
		else // User input received before previous input was processed.
		{
			std::this_thread::sleep_for((std::chrono::seconds(1)));
			goto check_input_processing;
		}
	}
}